

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O0

void Omega_h::partition_by_verts(Mesh *mesh,bool verbose)

{
  LO nrroots;
  Dist local_308;
  Read<long> local_278;
  Dist local_268;
  undefined1 local_1d8 [8];
  Dist elems2owners;
  Read<long> old_owner_globals;
  undefined1 local_118 [24];
  Dist uses2old_owners;
  RemoteGraph local_68;
  undefined1 local_38 [8];
  Remotes elem_uses;
  bool verbose_local;
  Mesh *mesh_local;
  
  elem_uses.idxs.write_.shared_alloc_.direct_ptr._7_1_ = verbose;
  get_own_verts2own_elems(&local_68,mesh);
  Remotes::Remotes((Remotes *)local_38,&local_68.edges2remotes);
  RemoteGraph::~RemoteGraph(&local_68);
  Mesh::comm((Mesh *)local_118);
  Remotes::Remotes((Remotes *)&old_owner_globals.write_.shared_alloc_.direct_ptr,(Remotes *)local_38
                  );
  nrroots = Mesh::nelems(mesh);
  Dist::Dist((Dist *)(local_118 + 0x10),(CommPtr *)local_118,
             (Remotes *)&old_owner_globals.write_.shared_alloc_.direct_ptr,nrroots);
  Remotes::~Remotes((Remotes *)&old_owner_globals.write_.shared_alloc_.direct_ptr);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_118);
  Mesh::dim(mesh);
  Mesh::globals((Mesh *)&elems2owners.comm_[1].
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                (Int)mesh);
  Dist::Dist(&local_268,(Dist *)(local_118 + 0x10));
  Read<long>::Read(&local_278,
                   (Read<int> *)
                   &elems2owners.comm_[1].
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  get_new_copies2old_owners((Dist *)local_1d8,&local_268,&local_278);
  Read<long>::~Read(&local_278);
  Dist::~Dist(&local_268);
  Dist::Dist(&local_308,(Dist *)local_1d8);
  migrate_mesh(mesh,&local_308,OMEGA_H_VERT_BASED,
               (bool)(elem_uses.idxs.write_.shared_alloc_.direct_ptr._7_1_ & 1));
  Dist::~Dist(&local_308);
  Dist::~Dist((Dist *)local_1d8);
  Read<long>::~Read((Read<long> *)
                    &elems2owners.comm_[1].
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Dist::~Dist((Dist *)(local_118 + 0x10));
  Remotes::~Remotes((Remotes *)local_38);
  return;
}

Assistant:

void partition_by_verts(Mesh* mesh, bool verbose) {
  /* vertex-based partitioning is defined as gathering the elements
   * adjacent to owned vertices, hence the graph from owned vertices
   * to elements already contains what we need and we can skip push_elem_uses()
   */
  auto elem_uses = get_own_verts2own_elems(mesh).edges2remotes;
  auto uses2old_owners = Dist(mesh->comm(), elem_uses, mesh->nelems());
  auto old_owner_globals = mesh->globals(mesh->dim());
  auto elems2owners =
      get_new_copies2old_owners(uses2old_owners, old_owner_globals);
  migrate_mesh(mesh, elems2owners, OMEGA_H_VERT_BASED, verbose);
}